

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall
gmlc::networking::TcpServer::TcpServer
          (TcpServer *this,io_context *io_context,string *address,string *port,bool port_reuse,
          int nominalBufferSize)

{
  SocketFactory local_18;
  
  local_18.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_18.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_18.encrypted = false;
  local_18.handshake_server = false;
  local_18._18_6_ = 0;
  TcpServer(this,&local_18,io_context,address,port,port_reuse,nominalBufferSize);
  return;
}

Assistant:

TcpServer::TcpServer(
    asio::io_context& io_context,
    const std::string& address,
    const std::string& port,
    bool port_reuse,
    int nominalBufferSize) :
    TcpServer::TcpServer(
        SocketFactory(),
        io_context,
        address,
        port,
        port_reuse,
        nominalBufferSize)
{
}